

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

void __thiscall
TPZFMatrix<long_double>::TPZFMatrix(TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *A)

{
  longdouble *__dest;
  ulong uVar1;
  
  TPZMatrix<long_double>::TPZMatrix
            (&this->super_TPZMatrix<long_double>,&PTR_PTR_01654978,
             (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow,
             (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_016546c0;
  this->fElem = (longdouble *)0x0;
  this->fGiven = (longdouble *)0x0;
  this->fSize = 0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016491a8;
  (this->fWork).fStore = (longdouble *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  if (uVar1 != 0) {
    __dest = (longdouble *)operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 * 0x10);
    this->fElem = __dest;
    memcpy(__dest,A->fElem,uVar1 * 0x10);
    return;
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(const TPZFMatrix<TVar> &A)
: TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>( A.fRow, A.fCol ), fElem(0), fGiven(0), fSize(0) {
    int64_t size = this->fRow * this->fCol;
    if(!size) return;
    fElem = new TVar[ size ] ;
#ifdef PZDEBUG2
    if ( size && fElem == NULL ) Error( "Constructor <memory allocation error>." );
#endif
    // Copia a matriz
    TVar * src = A.fElem;
    TVar * p = fElem;
    memcpy((void *)(p),(void *)(src),(size_t)size*sizeof(TVar));
}